

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O0

bool __thiscall
free_format_parser::HMpsFF::getMpsLine(HMpsFF *this,istream *file,string *strline,bool *skip)

{
  bool bVar1;
  _Alloc_hider _Var2;
  istream *piVar3;
  ulong uVar4;
  char *pcVar5;
  string *psVar6;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  string *in_RDX;
  istream *in_RSI;
  bool remove_trailing_comments;
  string *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar7;
  string *str;
  
  str = (string *)CONCAT71(in_register_00000009,in_CL);
  uVar7 = 0;
  str->_M_dataplus = (_Alloc_hider)0x0;
  piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(in_RSI,in_RDX);
  uVar4 = std::ios::operator!((_func_int *)
                              ((long)&piVar3->_vptr_basic_istream +
                              (long)piVar3->_vptr_basic_istream[-3]));
  if ((uVar4 & 1) == 0) {
    bVar1 = is_empty(str,(string *)CONCAT17(uVar7,in_stack_ffffffffffffffd0));
    if ((bVar1) ||
       (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX), *pcVar5 == '*')) {
      str->_M_dataplus = (_Alloc_hider)0x1;
    }
    else {
      psVar6 = trim((string *)CONCAT17(uVar7,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
      std::__cxx11::string::operator=(in_RDX,(string *)psVar6);
      _Var2 = (_Alloc_hider)is_empty(str,(string *)CONCAT17(uVar7,in_stack_ffffffffffffffd0));
      str->_M_dataplus = _Var2;
    }
    return true;
  }
  return false;
}

Assistant:

bool HMpsFF::getMpsLine(std::istream& file, std::string& strline, bool& skip) {
  const bool remove_trailing_comments = false;
  skip = false;
  if (!getline(file, strline)) return false;
  if (is_empty(strline) || strline[0] == '*') {
    skip = true;
  } else {
    if (remove_trailing_comments) {
      // Remove any trailing comment
      const size_t p = strline.find_first_of(mps_comment_chars);
      if (p <= strline.length()) {
        // A comment character has been found, so erase from it to the end
        // of the line and check whether the line is now empty
        strline.erase(p);
        skip = is_empty(strline);
        if (skip) return true;
      }
    }
    strline = trim(strline);
    skip = is_empty(strline);
  }
  return true;
}